

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Dtc_ObjCleanTruth_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  
  if (pObj->Value != 0) {
    pObj->Value = 0;
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Dtc_ObjCleanTruth_rec(pGVar2);
      pGVar2 = Gia_ObjFanin1(pObj);
      Dtc_ObjCleanTruth_rec(pGVar2);
    }
  }
  return;
}

Assistant:

void Dtc_ObjCleanTruth_rec( Gia_Obj_t * pObj )
{
    if ( !pObj->Value )
        return;
    pObj->Value = 0;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Dtc_ObjCleanTruth_rec( Gia_ObjFanin0(pObj) );
    Dtc_ObjCleanTruth_rec( Gia_ObjFanin1(pObj) );
}